

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O3

bool bssl::ext_cookie_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  CBB cookie;
  CBB contents;
  CBB local_70;
  CBB local_40;
  
  if ((hs->cookie).size_ == 0) {
    return true;
  }
  iVar1 = CBB_add_u16(out_compressible,0x2c);
  if ((((iVar1 != 0) &&
       (iVar1 = CBB_add_u16_length_prefixed(out_compressible,&local_40), iVar1 != 0)) &&
      (iVar1 = CBB_add_u16_length_prefixed(&local_40,&local_70), iVar1 != 0)) &&
     (iVar1 = CBB_add_bytes(&local_70,(hs->cookie).data_,(hs->cookie).size_), iVar1 != 0)) {
    iVar1 = CBB_flush(out_compressible);
    return iVar1 != 0;
  }
  return false;
}

Assistant:

size_t size() const { return size_; }